

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::appendv(ImGuiTextBuffer *this,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = args->reg_save_area;
  local_48._0_4_ = args->gp_offset;
  local_48._4_4_ = args->fp_offset;
  pvStack_40 = args->overflow_arg_area;
  uVar6 = vsnprintf((char *)0x0,0,fmt,args);
  pIVar5 = GImGui;
  if (0 < (int)uVar6) {
    iVar2 = (this->Buf).Size;
    iVar8 = uVar6 + iVar2;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= iVar8) {
      iVar9 = iVar3 * 2;
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 * -2 < 0) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pcVar7 = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar9);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar7,pcVar4,(long)(this->Buf).Size);
        }
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pcVar4);
        (this->Buf).Data = pcVar7;
        (this->Buf).Capacity = iVar9;
      }
    }
    pIVar5 = GImGui;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 < iVar8) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pcVar7 = (char *)(*(pIVar5->IO).MemAllocFn)((long)iVar9);
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          memcpy(pcVar7,pcVar4,(long)(this->Buf).Size);
        }
        pcVar4 = (this->Buf).Data;
        if (pcVar4 != (char *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pcVar4);
        (this->Buf).Data = pcVar7;
        (this->Buf).Capacity = iVar9;
      }
    }
    (this->Buf).Size = iVar8;
    pcVar4 = (this->Buf).Data;
    vsnprintf(pcVar4 + (long)iVar2 + -1,(ulong)uVar6 + 1,fmt,&local_48);
    pcVar4[((ulong)uVar6 - 1) + (long)iVar2] = '\0';
  }
  return;
}

Assistant:

void ImGuiTextBuffer::appendv(const char* fmt, va_list args)
{
    va_list args_copy;
    va_copy(args_copy, args);

    int len = vsnprintf(NULL, 0, fmt, args);         // FIXME-OPT: could do a first pass write attempt, likely successful on first pass.
    if (len <= 0)
        return;

    const int write_off = Buf.Size;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int double_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > double_capacity ? needed_sz : double_capacity);
    }

    Buf.resize(needed_sz);
    ImFormatStringV(&Buf[write_off] - 1, len+1, fmt, args_copy);
}